

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    ToYa::writeTile(this->_toYa,dx,dy,lx,ly);
    pthread_mutex_unlock(__mutex);
    return;
  }
  TiledOutputFile::writeTile(this->_outputFile,dx,dy,lx,ly);
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTile (dx, dy, lx, ly); }
}